

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p_setup.cpp
# Opt level: O0

void SetTextureNoErr(side_t *side,int position,DWORD *color,char *name,bool *validcolor,bool isFog)

{
  bool bVar1;
  int iVar2;
  ulong uVar3;
  size_t sVar4;
  long lVar5;
  int local_80;
  bool local_79;
  FNullTextureID local_74;
  FNullTextureID local_70;
  int local_6c;
  int local_68;
  int red;
  int green;
  int blue;
  int factor;
  FNullTextureID local_54;
  int l;
  char *stop;
  char local_3f [2];
  char name2 [9];
  FTextureID texture;
  bool isFog_local;
  bool *validcolor_local;
  char *name_local;
  DWORD *color_local;
  int position_local;
  side_t *side_local;
  
  FTextureID::FTextureID((FTextureID *)(name2 + 5));
  *validcolor = false;
  name2._1_4_ = FTextureManager::CheckForTexture(&TexMan,name,1,3);
  name2._5_4_ = name2._1_4_;
  bVar1 = FTextureID::Exists((FTextureID *)(name2 + 5));
  if (!bVar1) {
    strncpy((char *)((long)&stop + 3),name + 1,7);
    local_3f[1] = 0;
    if (*name != '#') {
      uVar3 = strtoul(name,(char **)&l,0x10);
      *color = (DWORD)uVar3;
      FNullTextureID::FNullTextureID(&local_54);
      local_79 = false;
      if ((*_l == '\0') && (local_79 = false, name + 2 <= _l)) {
        local_79 = _l <= name + 6;
      }
      *validcolor = local_79;
      return;
    }
    sVar4 = strlen(name);
    factor = (int)sVar4;
    FNullTextureID::FNullTextureID((FNullTextureID *)&blue);
    name2[5] = (undefined1)blue;
    name2[6] = blue._1_1_;
    name2[7] = blue._2_1_;
    name2[8] = blue._3_1_;
    *validcolor = false;
    if (6 < factor) {
      for (_l = (char *)((long)&stop + 3); _l < local_3f; _l = _l + 1) {
        iVar2 = isxdigit((int)*_l);
        if (iVar2 == 0) {
          *_l = '0';
        }
      }
      if (factor == 7) {
        local_80 = 0;
      }
      else {
        local_80 = clamp<int>(((int)local_3f[0] & 0xdfU) - 0x41,0,0x19);
      }
      green = local_80;
      local_3f[0] = '\0';
      lVar5 = strtol((char *)((long)&stop + 7),(char **)0x0,0x10);
      red = (int)lVar5;
      stop._7_1_ = 0;
      lVar5 = strtol((char *)((long)&stop + 5),(char **)0x0,0x10);
      local_68 = (int)lVar5;
      stop._5_1_ = 0;
      lVar5 = strtol((char *)((long)&stop + 3),(char **)0x0,0x10);
      local_6c = (int)lVar5;
      if (isFog) {
        green = 0;
      }
      else {
        if (green == 0) {
          *validcolor = false;
          return;
        }
        green = (green * 0xff) / 0x19;
      }
      *color = green << 0x18 | local_6c << 0x10 | local_68 << 8 | red;
      FNullTextureID::FNullTextureID(&local_70);
      *validcolor = true;
      return;
    }
    FNullTextureID::FNullTextureID(&local_74);
    name2._5_4_ = local_74.super_FTextureID.texnum;
  }
  side_t::SetTexture(side,position,(FTextureID)name2._5_4_);
  return;
}

Assistant:

static void SetTextureNoErr (side_t *side, int position, DWORD *color, const char *name, bool *validcolor, bool isFog)
{
	FTextureID texture;
	*validcolor = false;
	texture = TexMan.CheckForTexture (name, FTexture::TEX_Wall,	
		FTextureManager::TEXMAN_Overridable|FTextureManager::TEXMAN_TryAny);
	if (!texture.Exists())
	{
		char name2[9];
		char *stop;
		strncpy (name2, name+1, 7);
		name2[7] = 0;
		if (*name != '#')
		{
			*color = strtoul (name, &stop, 16);
			texture = FNullTextureID();
			*validcolor = (*stop == 0) && (stop >= name + 2) && (stop <= name + 6);
			return;
		}
		else	// Support for Legacy's color format!
		{
			int l=(int)strlen(name);
			texture = FNullTextureID();
			*validcolor = false;
			if (l>=7) 
			{
				for(stop=name2;stop<name2+6;stop++) if (!isxdigit(*stop)) *stop='0';

				int factor = l==7? 0 : clamp<int> ((name2[6]&223)-'A', 0, 25);

				name2[6]=0; int blue=strtol(name2+4,NULL,16);
				name2[4]=0; int green=strtol(name2+2,NULL,16);
				name2[2]=0; int red=strtol(name2,NULL,16);

				if (!isFog) 
				{
					if (factor==0) 
					{
						*validcolor=false;
						return;
					}
					factor = factor * 255 / 25;
				}
				else
				{
					factor=0;
				}

				*color=MAKEARGB(factor, red, green, blue);
				texture = FNullTextureID();
				*validcolor = true;
				return;
			}
		}
		texture = FNullTextureID();
	}
	side->SetTexture(position, texture);
}